

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

String * __thiscall
kj::_::NullableValue<kj::String>::emplace<kj::String>
          (NullableValue<kj::String> *this,String *params)

{
  if (this->isSet == true) {
    this->isSet = false;
    Array<char>::~Array(&(this->field_1).value.content);
  }
  (this->field_1).value.content.ptr = (params->content).ptr;
  (this->field_1).value.content.size_ = (params->content).size_;
  (this->field_1).value.content.disposer = (params->content).disposer;
  (params->content).ptr = (char *)0x0;
  (params->content).size_ = 0;
  this->isSet = true;
  return (String *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }